

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckCloseWithNaNFails::~TestCheckCloseWithNaNFails
          (TestCheckCloseWithNaNFails *this)

{
  TestCheckCloseWithNaNFails *this_local;
  
  ~TestCheckCloseWithNaNFails(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckCloseWithNaNFails)
{
    union
    {
        unsigned int bitpattern;
        float nan;
    };
    bitpattern = 0xFFFFFFFF;
    TestResults results;
    CheckClose(results, 3.0f, nan, 0.1f, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}